

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_wString __thiscall
ON_SubDVertex::ToString(ON_SubDVertex *this,bool bIncludeControlNetPoint,bool bIncludeTopology)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  char in_CL;
  ulong uVar6;
  undefined7 in_register_00000031;
  long lVar7;
  ON_wString flist;
  ON_wString elist;
  ON_wString vtag;
  ON_wString OStack_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_SubDVertex *local_40;
  ON_wString local_38;
  
  lVar7 = CONCAT71(in_register_00000031,bIncludeControlNetPoint);
  if ((ulong)*(byte *)(lVar7 + 0x60) < 5) {
    pwVar4 = *(wchar_t **)(&DAT_00819bf0 + (ulong)*(byte *)(lVar7 + 0x60) * 8);
  }
  else {
    pwVar4 = L"invalid";
  }
  ON_wString::ON_wString(&local_48,pwVar4);
  uVar1 = *(uint *)(lVar7 + 8);
  if (bIncludeTopology) {
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_48);
    ON_wString::FormatToString
              ((wchar_t *)this,*(undefined8 *)(lVar7 + 0x80),*(undefined8 *)(lVar7 + 0x88),
               *(undefined8 *)(lVar7 + 0x90),L"v%u %ls (%g,%g,%g)",(ulong)uVar1,pwVar4);
  }
  else {
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_48);
    ON_wString::FormatToString((wchar_t *)this,L"v%u %ls",(ulong)uVar1,pwVar4);
  }
  if (in_CL != '\0') {
    local_40 = this;
    ON_wString::FormatToString((wchar_t *)&local_50,L" Edges[%u]",(ulong)*(ushort *)(lVar7 + 0x68));
    if ((*(long *)(lVar7 + 0x70) != 0) && (*(short *)(lVar7 + 0x68) != 0)) {
      ON_wString::operator+=(&local_50,L"={");
      if (*(short *)(lVar7 + 0x68) != 0) {
        uVar6 = 0;
        do {
          uVar2 = *(ulong *)(*(long *)(lVar7 + 0x70) + uVar6 * 8);
          if (uVar6 != 0) {
            ON_wString::operator+=(&local_50,L", ");
          }
          uVar5 = uVar2 & 0xfffffffffffffff8;
          if (uVar5 == 0) {
            ON_wString::operator+=(&local_50,L"Null");
          }
          else {
            pwVar4 = L"-e%u";
            if ((uVar2 & 1) == 0) {
              pwVar4 = L"+e%u";
            }
            ON_wString::FormatToString((wchar_t *)&OStack_58,pwVar4,(ulong)*(uint *)(uVar5 + 8));
            ON_wString::operator+=(&local_50,&OStack_58);
            ON_wString::~ON_wString(&OStack_58);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < *(ushort *)(lVar7 + 0x68));
      }
      this = local_40;
      ON_wString::operator+=(&local_50,L"}");
    }
    ON_wString::operator+=((ON_wString *)this,&local_50);
    ON_wString::FormatToString((wchar_t *)&OStack_58,L" Faces[%u]",(ulong)*(ushort *)(lVar7 + 0x6a))
    ;
    if ((*(long *)(lVar7 + 0x78) != 0) && (*(short *)(lVar7 + 0x6a) != 0)) {
      ON_wString::operator+=(&OStack_58,L"={");
      if (*(short *)(lVar7 + 0x6a) != 0) {
        uVar6 = 0;
        do {
          lVar3 = *(long *)(*(long *)(lVar7 + 0x78) + uVar6 * 8);
          if (uVar6 != 0) {
            ON_wString::operator+=(&OStack_58,L", ");
          }
          if (lVar3 == 0) {
            ON_wString::operator+=(&OStack_58,L"Null");
          }
          else {
            ON_wString::FormatToString((wchar_t *)&local_38,L"f%u",(ulong)*(uint *)(lVar3 + 8));
            ON_wString::operator+=(&OStack_58,&local_38);
            ON_wString::~ON_wString(&local_38);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < *(ushort *)(lVar7 + 0x6a));
      }
      this = local_40;
      ON_wString::operator+=(&OStack_58,L"}");
    }
    ON_wString::operator+=((ON_wString *)this,&OStack_58);
    ON_wString::~ON_wString(&OStack_58);
    ON_wString::~ON_wString(&local_50);
  }
  ON_wString::~ON_wString(&local_48);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDVertex::ToString(
  bool bIncludeControlNetPoint,
  bool bIncludeTopology
) const
{
  const ON_wString vtag = ON_SubD::VertexTagToString(m_vertex_tag,false);
  ON_wString v
    = bIncludeControlNetPoint
    ? ON_wString::FormatToString(L"v%u %ls (%g,%g,%g)", m_id, static_cast<const wchar_t*>(vtag), m_P[0], m_P[1], m_P[2])
    : ON_wString::FormatToString(L"v%u %ls", m_id, static_cast<const wchar_t*>(vtag))
    ;
  if (bIncludeTopology)
  {
    ON_wString elist = ON_wString::FormatToString(L" Edges[%u]", EdgeCount());
    if (nullptr != m_edges && m_edge_count > 0)
    {
      elist += L"={";
      for (unsigned short vei = 0; vei < m_edge_count; ++vei)
      {
        const ON_SubDEdgePtr eptr = m_edges[vei];
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
        if (vei > 0)
          elist += L", ";
        if (nullptr == e)
          elist += L"Null";
        else
        {
          elist += (0 == ON_SUBD_EDGE_DIRECTION(eptr.m_ptr)) ? ON_wString::FormatToString(L"+e%u", e->m_id) : ON_wString::FormatToString(L"-e%u", e->m_id);
        }
      }
      elist += L"}";
    }
    v += elist;

    ON_wString flist = ON_wString::FormatToString(L" Faces[%u]", FaceCount());
    if (nullptr != m_faces && m_face_count > 0)
    {
      flist += L"={";
      for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
      {
        const ON_SubDFace* f = m_faces[vfi];
        if (vfi > 0)
          flist += L", ";
        if (nullptr == f)
          flist += L"Null";
        else
        {
          flist += ON_wString::FormatToString(L"f%u", f->m_id);
        }
      }
      flist += L"}";
    }
    v += flist;
  }
  return v;
}